

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar44;
  uint uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM12 [16];
  int iVar55;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  uint local_13c;
  uint local_138;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_rowcol_diag_sse41_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_rowcol_diag_sse41_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_rowcol_diag_sse41_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar17 = -open;
    iVar7 = matrix->min;
    uVar35 = 0x80000000 - iVar7;
    if (iVar7 != iVar17 && SBORROW4(iVar7,iVar17) == iVar7 + open < 0) {
      uVar35 = open | 0x80000000;
    }
    uVar24 = 0x7ffffffe - matrix->max;
    ppVar10 = parasail_result_new_rowcol1(_s1Len,s2Len);
    if (ppVar10 != (parasail_result_t *)0x0) {
      ppVar10->flag = ppVar10->flag | 0x4441001;
      uVar13 = (ulong)(s2Len + 6);
      ptr = parasail_memalign_int32_t(0x10,uVar13);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar13);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar13);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          iVar7 = _s1Len + 3;
          ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar7);
          if (ptr_02 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar2 = matrix->mapper;
            uVar13 = 0;
            do {
              ptr_02[uVar13] = piVar2[(byte)_s1[uVar13]];
              uVar13 = uVar13 + 1;
            } while ((uint)_s1Len != uVar13);
          }
          iVar8 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar7) {
            iVar8 = iVar7;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar8) * 4 + 4);
        }
        else {
          ptr_02 = (int32_t *)0x0;
        }
        uVar52 = s2Len + 3;
        local_13c = _s1Len - 1;
        local_138 = s2Len - 1;
        iVar7 = uVar35 + 1;
        iStack_e0 = iVar17 - gap;
        iStack_e4 = iVar17 + gap * -2;
        local_e8 = -(gap * 3 + open);
        piVar2 = matrix->mapper;
        uVar25 = (ulong)(uint)s2Len;
        uVar13 = 0;
        do {
          ptr[uVar13 + 3] = piVar2[(byte)_s2[uVar13]];
          uVar13 = uVar13 + 1;
        } while (uVar25 != uVar13);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar35 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar52) {
          uVar35 = uVar52;
        }
        uVar13 = 0;
        memset(ptr + uVar25 + 3,0,(ulong)(~s2Len + uVar35) * 4 + 4);
        iVar8 = iVar17;
        do {
          ptr_00[uVar13 + 3] = iVar8;
          ptr_01[uVar13 + 3] = iVar7;
          uVar13 = uVar13 + 1;
          iVar8 = iVar8 - gap;
        } while (uVar25 != uVar13);
        lVar11 = 0;
        do {
          ptr_00[lVar11] = iVar7;
          ptr_01[lVar11] = iVar7;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar11 = uVar25 + 3;
        do {
          ptr_00[lVar11] = iVar7;
          ptr_01[lVar11] = iVar7;
          lVar11 = lVar11 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar52);
        ptr_00[2] = 0;
        uVar35 = uVar24;
        uVar36 = uVar24;
        uVar37 = uVar24;
        uVar38 = uVar24;
        if (_s1Len < 1) {
          auVar33._4_4_ = iVar7;
          auVar33._0_4_ = iVar7;
          auVar33._8_4_ = iVar7;
          auVar33._12_4_ = iVar7;
          auVar39 = auVar33;
        }
        else {
          piVar2 = matrix->matrix;
          auVar5._4_4_ = iVar7;
          auVar5._0_4_ = iVar7;
          auVar5._8_4_ = iVar7;
          auVar33._12_4_ = iVar7;
          auVar33._0_12_ = auVar5;
          uVar13 = 1;
          if (1 < (int)uVar52) {
            uVar13 = (ulong)uVar52;
          }
          uVar16 = (ulong)(uint)_s1Len;
          uVar18 = (ulong)local_13c;
          auVar40 = pmovsxbd(in_XMM5,0x10203);
          uVar19 = 0;
          auVar39 = auVar33;
          iStack_dc = iVar17;
          do {
            uVar23 = uVar19 | 3;
            uVar52 = (uint)uVar19;
            if (matrix->type == 0) {
              uVar9 = ptr_02[uVar19 + 1];
              uVar12 = ptr_02[uVar19 + 2];
              uVar20 = ptr_02[uVar19];
              uVar14 = ptr_02[uVar23];
            }
            else {
              uVar9 = uVar52 | 1;
              if (uVar16 <= (uVar19 | 1)) {
                uVar9 = local_13c;
              }
              uVar12 = uVar52 | 2;
              if (uVar16 <= (uVar19 | 2)) {
                uVar12 = local_13c;
              }
              uVar20 = uVar52;
              uVar14 = uVar52 | 3;
              if (uVar16 <= uVar23) {
                uVar14 = local_13c;
              }
            }
            iVar8 = matrix->size;
            uVar1 = uVar19 + 4;
            auVar41._0_8_ = auVar5._4_8_;
            auVar41._12_4_ = ptr_00[2];
            auVar41._8_4_ = iVar7;
            ptr_00[2] = iVar17 - (int)uVar1 * gap;
            auVar46._12_4_ = iVar17 - uVar52 * gap;
            auVar46._8_4_ = iVar7;
            auVar46._0_8_ = auVar41._0_8_;
            uVar22 = uVar19 | 1;
            uVar15 = uVar19 | 2;
            auVar51._0_4_ = -(uint)(auVar40._0_4_ == local_13c);
            uVar52 = auVar40._4_4_;
            auVar51._4_4_ = -(uint)(uVar52 == local_13c);
            uVar53 = auVar40._8_4_;
            uVar54 = auVar40._12_4_;
            auVar51._8_4_ = -(uint)(uVar53 == local_13c);
            auVar51._12_4_ = -(uint)(uVar54 == local_13c);
            uVar21 = 0;
            in_XMM12 = pmovsxbd(in_XMM12,0xfffefd);
            auVar57._4_4_ = iVar7;
            auVar57._0_4_ = iVar7;
            auVar57._8_4_ = iVar7;
            auVar57._12_4_ = iVar7;
            auVar28 = auVar33;
            auVar62 = auVar57;
            do {
              iVar49 = auVar46._12_4_;
              auVar43._0_8_ = auVar46._4_8_;
              auVar42._0_12_ = auVar46._4_12_;
              auVar42._12_4_ = iVar49;
              auVar43._8_8_ = auVar42._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar21 + 3] << 0x20;
              iVar63 = piVar2[(long)(int)(uVar14 * iVar8) + (long)ptr[uVar21]] + auVar41._0_4_;
              iVar64 = piVar2[(long)(int)(uVar12 * iVar8) + (long)ptr[uVar21 + 1]] + auVar41._4_4_;
              iVar65 = piVar2[(long)(int)(uVar9 * iVar8) + (long)ptr[uVar21 + 2]] + auVar41._8_4_;
              iVar66 = piVar2[(long)(int)(uVar20 * iVar8) + (long)ptr[uVar21 + 3]] + auVar41._12_4_;
              iVar26 = auVar46._4_4_ - open;
              iVar30 = auVar46._8_4_ - open;
              iVar31 = iVar49 - open;
              iVar32 = ptr_00[uVar21 + 3] - open;
              iVar55 = auVar57._4_4_ - gap;
              iVar58 = auVar57._8_4_ - gap;
              iVar59 = auVar57._12_4_ - gap;
              iVar60 = ptr_01[uVar21 + 3] - gap;
              auVar56._0_4_ = (uint)(iVar55 < iVar26) * iVar26 | (uint)(iVar55 >= iVar26) * iVar55;
              auVar56._4_4_ = (uint)(iVar58 < iVar30) * iVar30 | (uint)(iVar58 >= iVar30) * iVar58;
              auVar56._8_4_ = (uint)(iVar59 < iVar31) * iVar31 | (uint)(iVar59 >= iVar31) * iVar59;
              auVar56._12_4_ = (uint)(iVar60 < iVar32) * iVar32 | (uint)(iVar60 >= iVar32) * iVar60;
              iVar26 = auVar46._0_4_ - open;
              iVar30 = auVar46._4_4_ - open;
              iVar31 = auVar46._8_4_ - open;
              iVar49 = iVar49 - open;
              iVar32 = auVar62._0_4_ - gap;
              iVar55 = auVar62._4_4_ - gap;
              iVar58 = auVar62._8_4_ - gap;
              iVar59 = auVar62._12_4_ - gap;
              auVar61._0_4_ = (uint)(iVar32 < iVar26) * iVar26 | (uint)(iVar32 >= iVar26) * iVar32;
              auVar61._4_4_ = (uint)(iVar55 < iVar30) * iVar30 | (uint)(iVar55 >= iVar30) * iVar55;
              auVar61._8_4_ = (uint)(iVar58 < iVar31) * iVar31 | (uint)(iVar58 >= iVar31) * iVar58;
              auVar61._12_4_ = (uint)(iVar59 < iVar49) * iVar49 | (uint)(iVar59 >= iVar49) * iVar59;
              uVar44 = ((int)auVar61._0_4_ < (int)auVar56._0_4_) * auVar56._0_4_ |
                       ((int)auVar61._0_4_ >= (int)auVar56._0_4_) * auVar61._0_4_;
              uVar47 = ((int)auVar61._4_4_ < (int)auVar56._4_4_) * auVar56._4_4_ |
                       ((int)auVar61._4_4_ >= (int)auVar56._4_4_) * auVar61._4_4_;
              uVar48 = ((int)auVar61._8_4_ < (int)auVar56._8_4_) * auVar56._8_4_ |
                       ((int)auVar61._8_4_ >= (int)auVar56._8_4_) * auVar61._8_4_;
              uVar50 = ((int)auVar61._12_4_ < (int)auVar56._12_4_) * auVar56._12_4_ |
                       ((int)auVar61._12_4_ >= (int)auVar56._12_4_) * auVar61._12_4_;
              auVar45._0_4_ =
                   (uint)((int)uVar44 < iVar63) * iVar63 | ((int)uVar44 >= iVar63) * uVar44;
              auVar45._4_4_ =
                   (uint)((int)uVar47 < iVar64) * iVar64 | ((int)uVar47 >= iVar64) * uVar47;
              auVar45._8_4_ =
                   (uint)((int)uVar48 < iVar65) * iVar65 | ((int)uVar48 >= iVar65) * uVar48;
              auVar45._12_4_ =
                   (uint)((int)uVar50 < iVar66) * iVar66 | ((int)uVar50 >= iVar66) * uVar50;
              uVar44 = in_XMM12._0_4_;
              auVar27._0_4_ = -(uint)(uVar44 == 0xffffffff);
              uVar47 = in_XMM12._4_4_;
              auVar27._4_4_ = -(uint)(uVar47 == 0xffffffff);
              uVar48 = in_XMM12._8_4_;
              uVar50 = in_XMM12._12_4_;
              auVar27._8_4_ = -(uint)(uVar48 == 0xffffffff);
              auVar27._12_4_ = -(uint)(uVar50 == 0xffffffff);
              auVar6._4_4_ = iStack_e4;
              auVar6._0_4_ = local_e8;
              auVar6._8_4_ = iStack_e0;
              auVar6._12_4_ = iStack_dc;
              auVar46 = blendvps(auVar45,auVar6,auVar27);
              auVar62._4_4_ = iVar7;
              auVar62._0_4_ = iVar7;
              auVar62._8_4_ = iVar7;
              auVar62._12_4_ = iVar7;
              auVar57 = blendvps(auVar56,auVar62,auVar27);
              auVar62 = blendvps(auVar61,auVar62,auVar27);
              iVar26 = auVar46._0_4_;
              iVar30 = auVar46._4_4_;
              iVar31 = auVar46._8_4_;
              iVar32 = auVar46._12_4_;
              auVar33 = auVar28;
              if (3 < uVar21) {
                uVar35 = (uint)(iVar26 < (int)uVar35) * iVar26 | (iVar26 >= (int)uVar35) * uVar35;
                uVar36 = (uint)(iVar30 < (int)uVar36) * iVar30 | (iVar30 >= (int)uVar36) * uVar36;
                uVar37 = (uint)(iVar31 < (int)uVar37) * iVar31 | (iVar31 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar32 < (int)uVar38) * iVar32 | (iVar32 >= (int)uVar38) * uVar38;
                iVar49 = auVar28._0_4_;
                auVar33._0_4_ = (uint)(iVar49 < iVar26) * iVar26 | (uint)(iVar49 >= iVar26) * iVar49
                ;
                iVar49 = auVar28._4_4_;
                auVar33._4_4_ = (uint)(iVar49 < iVar30) * iVar30 | (uint)(iVar49 >= iVar30) * iVar49
                ;
                iVar49 = auVar28._8_4_;
                iVar55 = auVar28._12_4_;
                auVar33._8_4_ = (uint)(iVar49 < iVar31) * iVar31 | (uint)(iVar49 >= iVar31) * iVar49
                ;
                auVar33._12_4_ =
                     (uint)(iVar55 < iVar32) * iVar32 | (uint)(iVar55 >= iVar32) * iVar55;
              }
              piVar3 = ((ppVar10->field_4).rowcols)->score_row;
              piVar4 = ((ppVar10->field_4).rowcols)->score_col;
              if (uVar19 == uVar18 && uVar21 < uVar25) {
                piVar3[uVar21] = iVar32;
              }
              if (local_138 == uVar21) {
                piVar4[uVar19] = iVar32;
              }
              if (uVar21 - 1 < uVar25 && uVar22 == uVar18) {
                piVar3[uVar21 - 1] = iVar31;
              }
              if (uVar25 == uVar21 && uVar22 < uVar16) {
                piVar4[uVar22] = iVar31;
              }
              if ((uVar15 == uVar18) && ((long)(uVar21 - 2) < (long)uVar25 && 1 < uVar21)) {
                piVar3[uVar21 - 2] = iVar30;
              }
              if (uVar25 + 1 == uVar21 && uVar15 < uVar16) {
                piVar4[uVar15] = iVar30;
              }
              if (2 < uVar21 && uVar23 == uVar18) {
                piVar3[uVar21 - 3] = iVar26;
              }
              if (uVar25 + 2 == uVar21 && uVar23 < uVar16) {
                piVar4[uVar23] = iVar26;
              }
              ptr_00[uVar21] = iVar26;
              auVar28._0_4_ = -(uint)(uVar44 == local_138);
              auVar28._4_4_ = -(uint)(uVar47 == local_138);
              auVar28._8_4_ = -(uint)(uVar48 == local_138);
              auVar28._12_4_ = -(uint)(uVar50 == local_138);
              auVar39 = blendvps(auVar39,auVar46,auVar28 & auVar51);
              ptr_01[uVar21] = auVar57._0_4_;
              in_XMM12._0_4_ = uVar44 + 1;
              in_XMM12._4_4_ = uVar47 + 1;
              in_XMM12._8_4_ = uVar48 + 1;
              in_XMM12._12_4_ = uVar50 + 1;
              uVar21 = uVar21 + 1;
              auVar28 = auVar33;
              auVar41 = auVar43;
            } while (uVar13 != uVar21);
            auVar40._0_4_ = auVar40._0_4_ + 4;
            auVar40._4_4_ = uVar52 + 4;
            auVar40._8_4_ = uVar53 + 4;
            auVar40._12_4_ = uVar54 + 4;
            local_e8 = local_e8 + gap * -4;
            iStack_e4 = iStack_e4 + gap * -4;
            iStack_e0 = iStack_e0 + gap * -4;
            iStack_dc = iStack_dc + gap * -4;
            uVar19 = uVar1;
          } while (uVar1 < uVar16);
        }
        iVar8 = 4;
        iVar17 = iVar7;
        do {
          uVar13 = auVar39._0_8_;
          lVar11 = auVar39._8_8_;
          if (iVar17 < auVar39._12_4_) {
            iVar17 = auVar39._12_4_;
          }
          auVar39._0_8_ = uVar13 << 0x20;
          auVar39._8_8_ = lVar11 << 0x20 | uVar13 >> 0x20;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        auVar29._0_4_ = -(uint)((int)uVar35 < iVar7);
        auVar29._4_4_ = -(uint)((int)uVar36 < iVar7);
        auVar29._8_4_ = -(uint)((int)uVar37 < iVar7);
        auVar29._12_4_ = -(uint)((int)uVar38 < iVar7);
        auVar34._0_4_ = -(uint)((int)uVar24 < auVar33._0_4_);
        auVar34._4_4_ = -(uint)((int)uVar24 < auVar33._4_4_);
        auVar34._8_4_ = -(uint)((int)uVar24 < auVar33._8_4_);
        auVar34._12_4_ = -(uint)((int)uVar24 < auVar33._12_4_);
        iVar7 = movmskps(0,auVar34 | auVar29);
        if (iVar7 != 0) {
          *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
          iVar17 = 0;
          local_138 = 0;
          local_13c = 0;
        }
        ppVar10->score = iVar17;
        ppVar10->end_query = local_13c;
        ppVar10->end_ref = local_138;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar10;
        }
        return ppVar10;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}